

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

int __thiscall
QTreeViewPrivate::widthHintForIndex
          (QTreeViewPrivate *this,QModelIndex *index,int hint,QStyleOptionViewItem *option,int i)

{
  Data *pDVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QEditorInfo *pQVar7;
  QSize QVar8;
  QSize QVar9;
  long *plVar10;
  long in_FS_OFFSET;
  QWidget *editor;
  QWidget *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar10 = *(long **)&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                       super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  pQVar7 = QAbstractItemViewPrivate::editorForIndex(&this->super_QAbstractItemViewPrivate,index);
  pDVar1 = (pQVar7->widget).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    local_40 = (QWidget *)0x0;
  }
  else {
    local_40 = (QWidget *)(pQVar7->widget).wp.value;
    if ((local_40 != (QWidget *)0x0) &&
       (bVar2 = QHash<QWidget_*,_QHashDummyValue>::contains
                          (&(this->super_QAbstractItemViewPrivate).persistent.q_hash,&local_40),
       bVar2)) {
      iVar3 = (**(code **)(*(long *)local_40 + 0x70))();
      if (hint < iVar3) {
        hint = iVar3;
      }
      QVar8 = QWidget::minimumSize(local_40);
      QVar9 = QWidget::maximumSize(local_40);
      if (QVar9.wd.m_i.m_i < hint) {
        hint = QVar9.wd.m_i.m_i;
      }
      if (hint <= QVar8.wd.m_i.m_i) {
        hint = QVar8.wd.m_i.m_i;
      }
    }
  }
  plVar10 = (long *)(**(code **)(*plVar10 + 0x208))(plVar10,index);
  iVar4 = (**(code **)(*plVar10 + 0x68))(plVar10,option,index);
  iVar3 = index->c;
  iVar5 = logicalIndexForTree(this);
  iVar6 = 0;
  if (iVar5 == iVar3) {
    iVar6 = indentationForItem(this,i);
  }
  iVar3 = iVar4 + iVar6;
  if (iVar4 + iVar6 < hint) {
    iVar3 = hint;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

int QTreeViewPrivate::widthHintForIndex(const QModelIndex &index, int hint, const QStyleOptionViewItem &option, int i) const
{
    Q_Q(const QTreeView);
    QWidget *editor = editorForIndex(index).widget.data();
    if (editor && persistent.contains(editor)) {
        hint = qMax(hint, editor->sizeHint().width());
        int min = editor->minimumSize().width();
        int max = editor->maximumSize().width();
        hint = qBound(min, hint, max);
    }
    int xhint = q->itemDelegateForIndex(index)->sizeHint(option, index).width();
    hint = qMax(hint, xhint + (isTreePosition(index.column()) ? indentationForItem(i) : 0));
    return hint;
}